

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeDeclaration_Tag.cpp
# Opt level: O0

MemberDeclarationSymbol * __thiscall
psy::C::TagDeclarationSymbol::member(TagDeclarationSymbol *this,Identifier *name)

{
  bool bVar1;
  SymbolKind SVar2;
  TypeKind TVar3;
  int iVar4;
  reference ppMVar5;
  undefined4 extraout_var;
  Type *pTVar6;
  ostream *poVar7;
  undefined4 extraout_var_00;
  TagDeclarationSymbol *this_00;
  MemberDeclarationSymbol *pMVar8;
  MemberDeclarationSymbol *innerMembDecl;
  TagDeclarationSymbol *tagTyDecl;
  FieldDeclarationSymbol *fldDecl;
  MemberDeclarationSymbol *membDecl;
  const_iterator __end1;
  const_iterator __begin1;
  Members *__range1;
  MemberDeclarationSymbol **local_40;
  MemberDeclarationSymbol **local_38;
  __normal_iterator<const_psy::C::MemberDeclarationSymbol_*const_*,_std::vector<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>_>
  local_30;
  __normal_iterator<const_psy::C::MemberDeclarationSymbol_*const_*,_std::vector<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>_>
  local_28;
  __normal_iterator<const_psy::C::MemberDeclarationSymbol_*const_*,_std::vector<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>_>
  it;
  Identifier *name_local;
  TagDeclarationSymbol *this_local;
  
  it._M_current = (MemberDeclarationSymbol **)name;
  local_30._M_current =
       (MemberDeclarationSymbol **)
       std::
       vector<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
       ::begin(&this->membDecls_);
  local_38 = (MemberDeclarationSymbol **)
             std::
             vector<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
             ::end(&this->membDecls_);
  local_40 = it._M_current;
  local_28 = std::
             find_if<__gnu_cxx::__normal_iterator<psy::C::MemberDeclarationSymbol_const*const*,std::vector<psy::C::MemberDeclarationSymbol_const*,std::allocator<psy::C::MemberDeclarationSymbol_const*>>>,psy::C::TagDeclarationSymbol::member(psy::C::Identifier_const*)const::__0>
                       (local_30,(__normal_iterator<const_psy::C::MemberDeclarationSymbol_*const_*,_std::vector<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>_>
                                  )local_38,it._M_current);
  __range1 = (Members *)
             std::
             vector<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
             ::end(&this->membDecls_);
  bVar1 = __gnu_cxx::operator!=
                    (&local_28,
                     (__normal_iterator<const_psy::C::MemberDeclarationSymbol_*const_*,_std::vector<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>_>
                      *)&__range1);
  if (bVar1) {
    ppMVar5 = __gnu_cxx::
              __normal_iterator<const_psy::C::MemberDeclarationSymbol_*const_*,_std::vector<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>_>
              ::operator*(&local_28);
    this_local = (TagDeclarationSymbol *)*ppMVar5;
  }
  else {
    __end1 = std::
             vector<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
             ::begin(&this->membDecls_);
    membDecl = (MemberDeclarationSymbol *)
               std::
               vector<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
               ::end(&this->membDecls_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_psy::C::MemberDeclarationSymbol_*const_*,_std::vector<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>_>
                                       *)&membDecl), bVar1) {
      ppMVar5 = __gnu_cxx::
                __normal_iterator<const_psy::C::MemberDeclarationSymbol_*const_*,_std::vector<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>_>
                ::operator*(&__end1);
      pMVar8 = *ppMVar5;
      SVar2 = Symbol::kind((Symbol *)pMVar8);
      if (SVar2 == FieldDeclaration) {
        iVar4 = (*(pMVar8->super_DeclarationSymbol).super_Symbol._vptr_Symbol[0x15])();
        pMVar8 = (MemberDeclarationSymbol *)CONCAT44(extraout_var,iVar4);
        bVar1 = FieldDeclarationSymbol::isAnonymousStructureOrUnion
                          ((FieldDeclarationSymbol *)pMVar8);
        if (bVar1) {
          pTVar6 = MemberDeclarationSymbol::type(pMVar8);
          TVar3 = Type::kind(pTVar6);
          if (TVar3 != Tag) {
            poVar7 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
            poVar7 = std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/symbols/TypeDeclaration_Tag.cpp"
                                    );
            poVar7 = std::operator<<(poVar7,":");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x61);
            poVar7 = std::operator<<(poVar7," ");
            poVar7 = std::operator<<(poVar7,"<empty message>");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          }
          pTVar6 = MemberDeclarationSymbol::type(pMVar8);
          iVar4 = (*pTVar6->_vptr_Type[0xd])();
          this_00 = TagType::declaration((TagType *)CONCAT44(extraout_var_00,iVar4));
          if ((this_00 != (TagDeclarationSymbol *)0x0) &&
             (pMVar8 = member(this_00,(Identifier *)it._M_current),
             pMVar8 != (MemberDeclarationSymbol *)0x0)) {
            return pMVar8;
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_psy::C::MemberDeclarationSymbol_*const_*,_std::vector<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>_>
      ::operator++(&__end1);
    }
    this_local = (TagDeclarationSymbol *)0x0;
  }
  return (MemberDeclarationSymbol *)this_local;
}

Assistant:

const MemberDeclarationSymbol* TagDeclarationSymbol::member(const Identifier* name) const
{
    auto it = std::find_if(membDecls_.begin(),
                           membDecls_.end(),
                           [name] (const MemberDeclarationSymbol* membDecl) {
                                return membDecl->name() == name;
                           });
    if (it != membDecls_.end())
        return *it;

    for (const auto membDecl : membDecls_) {
        if (membDecl->kind() != SymbolKind::FieldDeclaration)
            continue;
        auto fldDecl = membDecl->asFieldDeclaration();
        if (fldDecl->isAnonymousStructureOrUnion()) {
            PSY_ASSERT_2(fldDecl->type()->kind() == TypeKind::Tag, continue);
            auto tagTyDecl = fldDecl->type()->asTagType()->declaration();
            if (!tagTyDecl)
                continue;
            auto innerMembDecl = tagTyDecl->member(name);
            if (innerMembDecl)
                return innerMembDecl;
        }
    }
    return nullptr;
}